

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::relpath(string *__return_storage_ptr__,string *base,string *path)

{
  string local_40;
  string *local_20;
  string *path_local;
  string *base_local;
  
  local_20 = path;
  path_local = base;
  base_local = __return_storage_ptr__;
  basedir(&local_40,base);
  join(__return_storage_ptr__,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string relpath(const string &base, const string &path)
{
	return Path::join(basedir(base), path);
}